

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O1

void __thiscall draco::Mesh::DeleteAttribute(Mesh *this,int att_id)

{
  pointer *ppAVar1;
  pointer pAVar2;
  pointer pAVar3;
  pointer __src;
  
  PointCloud::DeleteAttribute(&this->super_PointCloud,att_id);
  if (-1 < att_id) {
    pAVar2 = (this->attribute_data_).
             super__Vector_base<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar3 = (this->attribute_data_).
             super__Vector_base<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (att_id < (int)((ulong)((long)pAVar3 - (long)pAVar2) >> 2)) {
      __src = pAVar2 + (ulong)(uint)att_id + 1;
      if (__src != pAVar3) {
        memmove(pAVar2 + (uint)att_id,__src,(long)pAVar3 - (long)__src);
      }
      ppAVar1 = &(this->attribute_data_).
                 super__Vector_base<draco::Mesh::AttributeData,_std::allocator<draco::Mesh::AttributeData>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppAVar1 = *ppAVar1 + -1;
    }
  }
  return;
}

Assistant:

void DeleteAttribute(int att_id) override {
    PointCloud::DeleteAttribute(att_id);
    if (att_id >= 0 && att_id < static_cast<int>(attribute_data_.size())) {
      attribute_data_.erase(attribute_data_.begin() + att_id);
    }
#ifdef DRACO_TRANSCODER_SUPPORTED
    UpdateMeshFeaturesAfterDeletedAttribute(att_id);
#endif
  }